

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O1

void duckdb::alp::AlpRDCompression<double,_false>::Compress
               (EXACT_TYPE *input_vector,idx_t n_values,State *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  ushort uVar6;
  __node_base_ptr p_Var7;
  mapped_type *pmVar8;
  unsigned_long uVar9;
  __hash_code __code;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int remainder;
  uint uVar15;
  uint16_t *in;
  uint64_t *in_00;
  __node_base_ptr p_Var16;
  uint bit;
  idx_t i;
  ulong uVar17;
  idx_t misaligned_count;
  uint16_t dictionary_key;
  uint16_t left_parts [1024];
  uint64_t right_parts [1024];
  uint64_t local_2938 [4];
  uint16_t local_2918 [112];
  uint16_t local_2838 [1024];
  uint64_t local_2038 [1025];
  
  if (n_values != 0) {
    bVar1 = state->right_bit_width;
    iVar11 = 0;
    do {
      uVar14 = input_vector[iVar11];
      local_2038[iVar11] = uVar14 & ~(-1L << (bVar1 & 0x3f));
      local_2838[iVar11] = (uint16_t)(uVar14 >> (bVar1 & 0x3f));
      iVar11 = iVar11 + 1;
    } while (n_values != iVar11);
    iVar11 = 0;
    do {
      local_2938[0]._0_2_ = local_2838[iVar11];
      uVar14 = (state->left_parts_dict_map)._M_h._M_bucket_count;
      uVar12 = (ulong)(ushort)local_2938[0] % uVar14;
      p_Var4 = (state->left_parts_dict_map)._M_h._M_buckets[uVar12 & 0xffffffff];
      p_Var7 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var7 = p_Var4, p_Var16 = p_Var4->_M_nxt,
         (ushort)local_2938[0] != *(ushort *)&p_Var4->_M_nxt[1]._M_nxt)) {
        while (p_Var5 = p_Var16->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var7 = (__node_base_ptr)0x0;
          if (((ulong)*(ushort *)&p_Var5[1]._M_nxt % uVar14 != uVar12) ||
             (p_Var7 = p_Var16, p_Var16 = p_Var5,
             (ushort)local_2938[0] == *(ushort *)&p_Var5[1]._M_nxt)) goto LAB_005b5406;
        }
        p_Var7 = (__node_base_ptr)0x0;
      }
LAB_005b5406:
      if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
        uVar6 = (ushort)state->actual_dictionary_size;
      }
      else {
        pmVar8 = ::std::__detail::
                 _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&state->left_parts_dict_map,(key_type *)local_2938);
        uVar6 = *pmVar8;
      }
      local_2838[iVar11] = uVar6;
      if (state->actual_dictionary_size <= uVar6) {
        uVar6 = state->exceptions_count;
        state->exceptions[uVar6] = (ushort)local_2938[0];
        state->exceptions_positions[uVar6] = (uint16_t)iVar11;
        state->exceptions_count = uVar6 + 1;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != n_values);
  }
  bVar1 = state->right_bit_width;
  uVar15 = (uint)n_values & 0x1f;
  iVar11 = n_values;
  if ((n_values & 0x1f) != 0) {
    uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(uVar15);
    iVar11 = (n_values - uVar9) + 0x20;
  }
  bVar2 = state->left_bit_width;
  iVar10 = n_values;
  if ((n_values & 0x1f) != 0) {
    uVar9 = NumericCastImpl<unsigned_long,_int,_false>::Convert(uVar15);
    iVar10 = (n_values - uVar9) + 0x20;
  }
  bVar3 = state->left_bit_width;
  uVar14 = (ulong)bVar3;
  uVar15 = (uint)n_values & 0x1f;
  uVar12 = n_values & 0xffffffffffffffe0;
  if (uVar12 != 0) {
    in = local_2838;
    uVar17 = 0;
    uVar13 = 0;
    do {
      duckdb_fastpforlib::internal::fastpack_half
                (in,(uint16_t *)(state->left_parts_encoded + (uVar17 >> 3)),(uint)bVar3);
      duckdb_fastpforlib::internal::fastpack_half
                (in + 0x10,(uint16_t *)(state->left_parts_encoded + (uVar17 >> 3) + uVar14 * 2),
                 (uint)bVar3);
      uVar13 = uVar13 + 0x20;
      in = in + 0x20;
      uVar17 = uVar17 + (ulong)bVar3 * 0x20;
    } while (uVar13 < uVar12);
  }
  if ((n_values & 0x1f) != 0) {
    uVar13 = (ulong)(uVar15 * 2);
    switchD_00570541::default((void *)((long)local_2938 + uVar13),0,0x40 - uVar13);
    switchD_00b1522a::default(local_2938,local_2838 + uVar12,uVar13);
    duckdb_fastpforlib::internal::fastpack_half
              ((uint16_t *)local_2938,
               (uint16_t *)(state->left_parts_encoded + (uVar12 * uVar14 >> 3)),(uint)bVar3);
    duckdb_fastpforlib::internal::fastpack_half
              (local_2918,
               (uint16_t *)(state->left_parts_encoded + (uVar12 * uVar14 >> 3) + uVar14 * 2),
               (uint)bVar3);
  }
  bVar3 = state->right_bit_width;
  bit = (uint)bVar3;
  if (uVar12 != 0) {
    in_00 = local_2038;
    uVar14 = 0;
    uVar13 = 0;
    do {
      duckdb_fastpforlib::fastpack
                (in_00,(uint32_t *)(state->right_parts_encoded + (uVar14 >> 3)),bit);
      uVar13 = uVar13 + 0x20;
      in_00 = in_00 + 0x20;
      uVar14 = uVar14 + (ulong)bVar3 * 0x20;
    } while (uVar13 < uVar12);
  }
  if ((n_values & 0x1f) != 0) {
    uVar14 = (ulong)(uVar15 << 3);
    switchD_00570541::default((void *)((long)local_2938 + uVar14),0,0x100 - uVar14);
    switchD_00b1522a::default(local_2938,local_2038 + uVar12,uVar14);
    duckdb_fastpforlib::fastpack
              (local_2938,(uint32_t *)(state->right_parts_encoded + (bit * uVar12 >> 3)),bit);
  }
  state->left_bit_packed_size = iVar10 * bVar2 >> 3;
  state->right_bit_packed_size = iVar11 * bVar1 >> 3;
  return;
}

Assistant:

static void Compress(const EXACT_TYPE *input_vector, idx_t n_values, State &state) {

		uint64_t right_parts[AlpRDConstants::ALP_VECTOR_SIZE];
		uint16_t left_parts[AlpRDConstants::ALP_VECTOR_SIZE];

		// Cutting the floating point values
		for (idx_t i = 0; i < n_values; i++) {
			EXACT_TYPE tmp = input_vector[i];
			right_parts[i] = tmp & ((1ULL << state.right_bit_width) - 1);
			left_parts[i] = UnsafeNumericCast<uint16_t>(tmp >> state.right_bit_width);
		}

		// Dictionary encoding for left parts
		for (idx_t i = 0; i < n_values; i++) {
			uint16_t dictionary_index;
			auto dictionary_key = left_parts[i];
			if (state.left_parts_dict_map.find(dictionary_key) == state.left_parts_dict_map.end()) {
				//! If not found on the dictionary we store the smallest non-key index as exception (the dict size)
				dictionary_index = state.actual_dictionary_size;
			} else {
				dictionary_index = state.left_parts_dict_map[dictionary_key];
			}
			left_parts[i] = dictionary_index;

			//! Left parts not found in the dictionary are stored as exceptions
			if (dictionary_index >= state.actual_dictionary_size) {
				state.exceptions[state.exceptions_count] = dictionary_key;
				state.exceptions_positions[state.exceptions_count] = UnsafeNumericCast<uint16_t>(i);
				state.exceptions_count++;
			}
		}

		auto right_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.right_bit_width);
		auto left_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.left_bit_width);

		if (!EMPTY) {
			// Bitpacking Left and Right parts
			BitpackingPrimitives::PackBuffer<uint16_t, false>(state.left_parts_encoded, left_parts, n_values,
			                                                  state.left_bit_width);
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.right_parts_encoded, right_parts, n_values,
			                                                  state.right_bit_width);
		}

		state.left_bit_packed_size = left_bit_packed_size;
		state.right_bit_packed_size = right_bit_packed_size;
	}